

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int fts3SavepointMethod(sqlite3_vtab *pVtab,int iSavepoint)

{
  _func_int_sqlite3_vtab_cursor_ptr *iRowid;
  sqlite3_stmt *pStmt;
  int iVar1;
  int iVar2;
  sqlite3_stmt *psStack_30;
  
  if (*(char *)&pVtab[0x13].pModule != '\0') {
    return 0;
  }
  iRowid = (pVtab[1].pModule)->xClose;
  iVar1 = sqlite3Fts3PendingTermsFlush((Fts3Table *)pVtab);
  if (iVar1 == 0) {
    iVar1 = 0;
    if (((4 < *(uint *)((long)&pVtab[4].pModule + 4)) && (*(int *)&pVtab[4].pModule != 0)) &&
       (iVar1 = 0, *(int *)&pVtab[4].pModule != 0xff)) {
      psStack_30 = (sqlite3_stmt *)0x0;
      iVar2 = 0;
      iVar1 = fts3SqlStmt((Fts3Table *)pVtab,0x24,&psStack_30,(sqlite3_value **)0x0);
      pStmt = psStack_30;
      if (iVar1 == 0) {
        iVar1 = sqlite3_step(psStack_30);
        iVar2 = 0;
        if (iVar1 == 100) {
          iVar2 = sqlite3_column_int(pStmt,0);
        }
        iVar1 = sqlite3_reset(pStmt);
      }
      iVar2 = iVar2 * *(int *)((long)&pVtab[4].pModule + 4);
      iVar2 = iVar2 / 2 + iVar2;
      if (0x40 < iVar2) {
        iVar1 = sqlite3Fts3Incrmerge((Fts3Table *)pVtab,iVar2,*(int *)&pVtab[4].pModule);
      }
    }
  }
  sqlite3Fts3SegmentsClose((Fts3Table *)pVtab);
  sqlite3_set_last_insert_rowid((sqlite3 *)pVtab[1].pModule,(sqlite3_int64)iRowid);
  return iVar1;
}

Assistant:

static int fts3SavepointMethod(sqlite3_vtab *pVtab, int iSavepoint){
  int rc = SQLITE_OK;
  UNUSED_PARAMETER(iSavepoint);
  assert( ((Fts3Table *)pVtab)->inTransaction );
  assert( ((Fts3Table *)pVtab)->mxSavepoint <= iSavepoint );
  TESTONLY( ((Fts3Table *)pVtab)->mxSavepoint = iSavepoint );
  if( ((Fts3Table *)pVtab)->bIgnoreSavepoint==0 ){
    rc = fts3SyncMethod(pVtab);
  }
  return rc;
}